

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

bool __thiscall OpenMD::StringTokenizer::nextTokenAsBool(StringTokenizer *this)

{
  istream *piVar1;
  ostream *poVar2;
  bool result;
  string token;
  istringstream iss;
  
  nextToken_abi_cxx11_(&token,this);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&token,_S_in);
  piVar1 = std::istream::_M_extract<bool>((bool *)&iss);
  if (((&piVar1->field_0x20)[(long)piVar1->_vptr_basic_istream[-3]] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"unable to convert ");
    poVar2 = std::operator<<(poVar2,(string *)&token);
    poVar2 = std::operator<<(poVar2," to a bool");
    std::endl<char,std::char_traits<char>>(poVar2);
    result = false;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&token);
  return result;
}

Assistant:

bool StringTokenizer::nextTokenAsBool() {
    std::string token = nextToken();
    std::istringstream iss(token);
    bool result;

    if (iss >> result) {
      return result;
    } else {
      std::cerr << "unable to convert " << token << " to a bool" << std::endl;
      return false;
    }
  }